

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int archive_read_format_cpio_cleanup(archive_read *a)

{
  void *__ptr;
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  __ptr = a->format->data;
  puVar2 = *(undefined8 **)((long)__ptr + 0x10);
  while (puVar2 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar2;
    free((void *)puVar2[5]);
    free(*(void **)((long)__ptr + 0x10));
    *(undefined8 **)((long)__ptr + 0x10) = puVar1;
    puVar2 = puVar1;
  }
  free(__ptr);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_cpio_cleanup(struct archive_read *a)
{
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);
        /* Free inode->name map */
        while (cpio->links_head != NULL) {
                struct links_entry *lp = cpio->links_head->next;

                free(cpio->links_head->name);
                free(cpio->links_head);
                cpio->links_head = lp;
        }
	free(cpio);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}